

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_sse41_128_32.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_table_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  undefined1 (*pauVar2) [16];
  uint *puVar3;
  undefined8 *puVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  void *pvVar7;
  void *pvVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  parasail_result_t *ppVar16;
  __m128i *palVar17;
  __m128i *palVar18;
  __m128i *palVar19;
  __m128i *ptr;
  __m128i *b;
  __m128i *ptr_00;
  __m128i *palVar20;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  int32_t *ptr_03;
  uint uVar21;
  size_t len;
  ulong uVar22;
  uint uVar23;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  ulong uVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  ushort uVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  ulong uVar38;
  int iVar39;
  ulong uVar40;
  long lVar41;
  bool bVar42;
  ulong uVar43;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  ulong uVar46;
  uint uVar47;
  int iVar48;
  uint uVar49;
  int iVar50;
  uint uVar51;
  int iVar52;
  uint uVar54;
  int iVar55;
  ulong uVar53;
  uint uVar56;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar67;
  uint uVar69;
  uint uVar71;
  undefined1 auVar63 [16];
  int iVar62;
  int iVar68;
  int iVar70;
  int iVar72;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  uint uVar73;
  uint uVar74;
  uint uVar76;
  uint uVar77;
  undefined1 auVar75 [16];
  uint uVar78;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  ulong uVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  uint uVar90;
  int iVar92;
  undefined1 auVar91 [16];
  int iVar93;
  int iVar95;
  int iVar96;
  int iVar97;
  int iVar98;
  undefined1 auVar94 [16];
  int iVar99;
  uint uVar100;
  uint uVar101;
  uint uVar102;
  undefined1 auVar103 [16];
  int iVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i_32_t e;
  __m128i_32_t h;
  __m128i *local_1c0;
  __m128i *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  __m128i *local_188;
  undefined8 local_128;
  undefined8 uStack_120;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  longlong extraout_RDX_00;
  int32_t iVar57;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_table_striped_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar5 = (profile->profile32).score;
    if (pvVar5 == (void *)0x0) {
      parasail_nw_stats_table_striped_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_table_striped_profile_sse41_128_32_cold_6();
      }
      else {
        uVar21 = profile->s1Len;
        if ((int)uVar21 < 1) {
          parasail_nw_stats_table_striped_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_table_striped_profile_sse41_128_32_cold_4();
        }
        else {
          uVar40 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_stats_table_striped_profile_sse41_128_32_cold_3();
          }
          else if (open < 0) {
            parasail_nw_stats_table_striped_profile_sse41_128_32_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_stats_table_striped_profile_sse41_128_32_cold_1();
          }
          else {
            iVar39 = uVar21 - 1;
            uVar38 = (ulong)uVar21 + 3 >> 2;
            iVar37 = (int)uVar38;
            uVar23 = iVar39 % iVar37;
            iVar36 = -open;
            iVar27 = ppVar6->min;
            uVar15 = 0x80000000 - iVar27;
            if (iVar27 != iVar36 && SBORROW4(iVar27,iVar36) == iVar27 + open < 0) {
              uVar15 = open | 0x80000000;
            }
            pvVar7 = (profile->profile32).matches;
            uVar12 = 0x7ffffffe - ppVar6->max;
            pvVar8 = (profile->profile32).similar;
            ppVar16 = parasail_result_new_table3((uint)((ulong)uVar21 + 3) & 0x7ffffffc,s2Len);
            if (ppVar16 != (parasail_result_t *)0x0) {
              ppVar16->flag = ppVar16->flag | 0x4430801;
              palVar17 = parasail_memalign___m128i(0x10,uVar38);
              uStack_1a0 = local_1a8;
              local_1a8 = palVar17;
              palVar18 = parasail_memalign___m128i(0x10,uVar38);
              palVar19 = parasail_memalign___m128i(0x10,uVar38);
              ptr = parasail_memalign___m128i(0x10,uVar38);
              b = parasail_memalign___m128i(0x10,uVar38);
              ptr_00 = parasail_memalign___m128i(0x10,uVar38);
              palVar20 = parasail_memalign___m128i(0x10,uVar38);
              ptr_01 = parasail_memalign___m128i(0x10,uVar38);
              ptr_02 = parasail_memalign___m128i(0x10,uVar38);
              b_00 = parasail_memalign___m128i(0x10,uVar38);
              b_01 = parasail_memalign___m128i(0x10,uVar38);
              b_02 = parasail_memalign___m128i(0x10,uVar38);
              ptr_03 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = (b_01 == (__m128i *)0x0 ||
                           (b_00 == (__m128i *)0x0 ||
                           (ptr_02 == (__m128i *)0x0 || ptr_01 == (__m128i *)0x0))) ||
                           ((palVar20 == (__m128i *)0x0 ||
                            (ptr_00 == (__m128i *)0x0 || b == (__m128i *)0x0)) ||
                           ((ptr == (__m128i *)0x0 || palVar19 == (__m128i *)0x0) ||
                           (palVar18 == (__m128i *)0x0 || palVar17 == (__m128i *)0x0)));
              len = CONCAT71((int7)((ulong)palVar18 >> 8),
                             (ptr_03 == (int32_t *)0x0 || b_02 == (__m128i *)0x0) || c[1]._0_1_);
              if ((ptr_03 != (int32_t *)0x0 && b_02 != (__m128i *)0x0) &&
                  ((b_01 != (__m128i *)0x0 &&
                   (b_00 != (__m128i *)0x0 && (ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0)
                   )) && ((palVar20 != (__m128i *)0x0 &&
                          (ptr_00 != (__m128i *)0x0 && b != (__m128i *)0x0)) &&
                         ((ptr != (__m128i *)0x0 && palVar19 != (__m128i *)0x0) &&
                         (palVar18 != (__m128i *)0x0 && palVar17 != (__m128i *)0x0))))) {
                iVar13 = s2Len + -1;
                iVar14 = 3 - iVar39 / iVar37;
                uVar15 = uVar15 + 1;
                c[0] = uVar38;
                parasail_memset___m128i(palVar19,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = uVar38;
                parasail_memset___m128i(b,c_00,len);
                c_01[1] = extraout_RDX_01;
                c_01[0] = uVar38;
                parasail_memset___m128i(palVar20,c_01,len);
                c_02[1] = extraout_RDX_02;
                c_02[0] = uVar38;
                parasail_memset___m128i(b_00,c_02,len);
                c_03[1] = extraout_RDX_03;
                c_03[0] = uVar38;
                parasail_memset___m128i(b_01,c_03,len);
                pmovsxbd(extraout_XMM0,0x1010101);
                c_04[1] = extraout_RDX_04;
                c_04[0] = uVar38;
                parasail_memset___m128i(b_02,c_04,len);
                uVar24 = 0;
                iVar27 = iVar36;
                do {
                  lVar29 = 0;
                  iVar28 = iVar27;
                  do {
                    *(int *)((long)&local_48 + lVar29 * 4) = iVar28;
                    lVar30 = (long)iVar28 - (ulong)(uint)open;
                    if (lVar30 < -0x7fffffff) {
                      lVar30 = -0x80000000;
                    }
                    *(int *)((long)&local_58 + lVar29 * 4) = (int)lVar30;
                    lVar29 = lVar29 + 1;
                    iVar28 = iVar28 - gap * iVar37;
                  } while (lVar29 != 4);
                  palVar17[uVar24][0] = local_48;
                  palVar17[uVar24][1] = lStack_40;
                  ptr_02[uVar24][0] = local_58;
                  ptr_02[uVar24][1] = lStack_50;
                  uVar24 = uVar24 + 1;
                  iVar27 = iVar27 - gap;
                } while (uVar24 != uVar38);
                *ptr_03 = 0;
                uVar24 = 1;
                do {
                  ptr_03[uVar24] = iVar36;
                  uVar24 = uVar24 + 1;
                  iVar36 = iVar36 - gap;
                } while (s2Len + 1 != uVar24);
                uVar21 = iVar37 - 1;
                uVar24 = uVar40;
                if (s2Len < 2) {
                  uVar24 = 1;
                }
                lVar30 = uVar38 * uVar40;
                lVar29 = lVar30 * 4;
                lVar25 = lVar30 * 8;
                lVar30 = lVar30 * 0xc;
                lVar34 = (ulong)(iVar37 + (uint)(iVar37 == 0)) << 4;
                lVar32 = 0;
                uVar22 = 0;
                uVar73 = uVar15;
                uVar74 = uVar15;
                uVar76 = uVar15;
                uVar77 = uVar15;
                uVar78 = uVar12;
                uVar79 = uVar12;
                uVar80 = uVar12;
                uVar81 = uVar12;
                do {
                  local_188 = ptr_01;
                  local_1b0 = palVar18;
                  local_1c0 = ptr_00;
                  ptr_00 = b;
                  palVar17 = ptr;
                  ptr = palVar19;
                  ptr_01 = palVar20;
                  palVar18 = local_1a8;
                  palVar20 = local_1a8 + uVar21;
                  palVar19 = ptr + uVar21;
                  iVar99 = (int)(*palVar19)[0];
                  iVar104 = *(int *)((long)*palVar19 + 4);
                  iVar92 = (int)(*palVar19)[1];
                  palVar19 = ptr_00 + uVar21;
                  iVar50 = (int)(*palVar19)[0];
                  iVar52 = *(int *)((long)*palVar19 + 4);
                  iVar55 = (int)(*palVar19)[1];
                  palVar19 = ptr_01 + uVar21;
                  iVar95 = (int)(*palVar19)[0];
                  iVar96 = *(int *)((long)*palVar19 + 4);
                  iVar98 = (int)(*palVar19)[1];
                  iVar97 = 0;
                  iVar48 = 0;
                  iVar93 = 0;
                  palVar19 = local_1a8 + uVar21;
                  iVar27 = (int)(*palVar19)[0];
                  iVar36 = *(int *)((long)*palVar19 + 4);
                  iVar28 = (int)(*palVar19)[1];
                  iVar57 = ptr_03[uVar22];
                  lVar26 = (long)ppVar6->mapper[(byte)s2[uVar22]] * uVar38 * 0x10;
                  auVar86 = ZEXT816(0);
                  lVar35 = 0;
                  auVar89 = ZEXT816(0);
                  lVar31 = lVar32;
                  auVar87 = _DAT_008d0f00;
                  uVar100 = uVar15;
                  uVar101 = uVar15;
                  uVar102 = uVar15;
                  uVar90 = uVar15;
                  do {
                    piVar1 = (int *)((long)pvVar5 + lVar35 + lVar26);
                    uVar56 = iVar57 + *piVar1;
                    uVar58 = iVar27 + piVar1[1];
                    uVar59 = iVar36 + piVar1[2];
                    uVar60 = iVar28 + piVar1[3];
                    piVar1 = (int *)((long)*ptr_02 + lVar35);
                    iVar62 = *piVar1;
                    iVar68 = piVar1[1];
                    iVar70 = piVar1[2];
                    iVar72 = piVar1[3];
                    uVar61 = (uint)((int)uVar56 < iVar62) * iVar62 |
                             ((int)uVar56 >= iVar62) * uVar56;
                    uVar67 = (uint)((int)uVar58 < iVar68) * iVar68 |
                             ((int)uVar58 >= iVar68) * uVar58;
                    uVar69 = (uint)((int)uVar59 < iVar70) * iVar70 |
                             ((int)uVar59 >= iVar70) * uVar59;
                    uVar71 = (uint)((int)uVar60 < iVar72) * iVar72 |
                             ((int)uVar60 >= iVar72) * uVar60;
                    uVar47 = ((int)uVar61 < (int)uVar100) * uVar100 |
                             ((int)uVar61 >= (int)uVar100) * uVar61;
                    uVar49 = ((int)uVar67 < (int)uVar101) * uVar101 |
                             ((int)uVar67 >= (int)uVar101) * uVar67;
                    uVar51 = ((int)uVar69 < (int)uVar102) * uVar102 |
                             ((int)uVar69 >= (int)uVar102) * uVar69;
                    uVar54 = ((int)uVar71 < (int)uVar90) * uVar90 |
                             ((int)uVar71 >= (int)uVar90) * uVar71;
                    auVar66 = *(undefined1 (*) [16])((long)*b_00 + lVar35);
                    auVar64 = *(undefined1 (*) [16])((long)*b_01 + lVar35);
                    pauVar2 = (undefined1 (*) [16])((long)*b_02 + lVar35);
                    uVar10 = *(undefined8 *)*pauVar2;
                    uVar11 = *(undefined8 *)(*pauVar2 + 8);
                    auVar82 = *pauVar2;
                    puVar3 = (uint *)((long)*local_1b0 + lVar35);
                    *puVar3 = uVar47;
                    puVar3[1] = uVar49;
                    puVar3[2] = uVar51;
                    puVar3[3] = uVar54;
                    auVar63._0_4_ = -(uint)((int)uVar100 < (int)uVar61);
                    auVar63._4_4_ = -(uint)((int)uVar101 < (int)uVar67);
                    auVar63._8_4_ = -(uint)((int)uVar102 < (int)uVar69);
                    auVar63._12_4_ = -(uint)((int)uVar90 < (int)uVar71);
                    auVar105 = blendvps(auVar89,auVar66,auVar63);
                    piVar1 = (int *)((long)pvVar7 + lVar35 + lVar26);
                    auVar106._0_4_ = iVar97 + *piVar1;
                    auVar106._4_4_ = iVar99 + piVar1[1];
                    auVar106._8_4_ = iVar104 + piVar1[2];
                    auVar106._12_4_ = iVar92 + piVar1[3];
                    auVar103._0_4_ = -(uint)(uVar56 == uVar47);
                    auVar103._4_4_ = -(uint)(uVar58 == uVar49);
                    auVar103._8_4_ = -(uint)(uVar59 == uVar51);
                    auVar103._12_4_ = -(uint)(uVar60 == uVar54);
                    auVar106 = blendvps(auVar105,auVar106,auVar103);
                    *(undefined1 (*) [16])((long)*palVar17 + lVar35) = auVar106;
                    auVar105 = blendvps(auVar86,auVar64,auVar63);
                    piVar1 = (int *)((long)pvVar8 + lVar35 + lVar26);
                    auVar91._0_4_ = iVar48 + *piVar1;
                    auVar91._4_4_ = iVar50 + piVar1[1];
                    auVar91._8_4_ = iVar52 + piVar1[2];
                    auVar91._12_4_ = iVar55 + piVar1[3];
                    auVar91 = blendvps(auVar105,auVar91,auVar103);
                    *(undefined1 (*) [16])((long)*local_1c0 + lVar35) = auVar91;
                    auVar82 = blendvps(auVar87,auVar82,auVar63);
                    auVar94._0_4_ = iVar93 + 1;
                    auVar94._4_4_ = iVar95 + 1;
                    auVar94._8_4_ = iVar96 + 1;
                    auVar94._12_4_ = iVar98 + 1;
                    auVar82 = blendvps(auVar82,auVar94,auVar103);
                    *(undefined1 (*) [16])((long)*local_188 + lVar35) = auVar82;
                    lVar41 = *(long *)((long)((ppVar16->field_4).trace)->trace_del_table + 8);
                    iVar104 = auVar106._0_4_;
                    *(int *)(lVar41 + lVar31) = iVar104;
                    lVar41 = lVar41 + lVar31;
                    uVar9 = extractps(auVar106,1);
                    *(undefined8 *)(lVar29 + lVar41) = uVar9;
                    uVar9 = extractps(auVar106,2);
                    *(undefined8 *)(lVar25 + lVar41) = uVar9;
                    uVar9 = extractps(auVar106,3);
                    *(undefined8 *)(lVar30 + lVar41) = uVar9;
                    lVar41 = *(long *)((long)((ppVar16->field_4).trace)->trace_del_table + 0x10);
                    iVar27 = auVar91._0_4_;
                    *(int *)(lVar41 + lVar31) = iVar27;
                    lVar41 = lVar41 + lVar31;
                    uVar9 = extractps(auVar91,1);
                    *(undefined8 *)(lVar29 + lVar41) = uVar9;
                    uVar9 = extractps(auVar91,2);
                    *(undefined8 *)(lVar25 + lVar41) = uVar9;
                    uVar9 = extractps(auVar91,3);
                    *(undefined8 *)(lVar30 + lVar41) = uVar9;
                    lVar41 = *(long *)((long)((ppVar16->field_4).trace)->trace_del_table + 0x18);
                    iVar97 = auVar82._0_4_;
                    *(int *)(lVar41 + lVar31) = iVar97;
                    lVar41 = lVar41 + lVar31;
                    uVar9 = extractps(auVar82,1);
                    *(undefined8 *)(lVar29 + lVar41) = uVar9;
                    uVar9 = extractps(auVar82,2);
                    *(undefined8 *)(lVar25 + lVar41) = uVar9;
                    uVar9 = extractps(auVar82,3);
                    *(undefined8 *)(lVar30 + lVar41) = uVar9;
                    lVar41 = *((ppVar16->field_4).trace)->trace_del_table;
                    *(uint *)(lVar41 + lVar31) = uVar47;
                    lVar41 = lVar41 + lVar31;
                    *(uint *)(lVar29 + lVar41) = uVar49;
                    *(uint *)(lVar25 + lVar41) = uVar51;
                    *(uint *)(lVar30 + lVar41) = uVar54;
                    uVar78 = ((int)uVar47 < (int)uVar78) * uVar47 |
                             ((int)uVar47 >= (int)uVar78) * uVar78;
                    uVar79 = ((int)uVar49 < (int)uVar79) * uVar49 |
                             ((int)uVar49 >= (int)uVar79) * uVar79;
                    uVar80 = ((int)uVar51 < (int)uVar80) * uVar51 |
                             ((int)uVar51 >= (int)uVar80) * uVar80;
                    uVar81 = ((int)uVar54 < (int)uVar81) * uVar54 |
                             ((int)uVar54 >= (int)uVar81) * uVar81;
                    uVar73 = ((int)uVar73 < (int)uVar47) * uVar47 |
                             ((int)uVar73 >= (int)uVar47) * uVar73;
                    uVar56 = ((int)uVar74 < (int)uVar49) * uVar49 |
                             ((int)uVar74 >= (int)uVar49) * uVar74;
                    uVar58 = ((int)uVar76 < (int)uVar51) * uVar51 |
                             ((int)uVar76 >= (int)uVar51) * uVar76;
                    uVar59 = ((int)uVar77 < (int)uVar54) * uVar54 |
                             ((int)uVar77 >= (int)uVar54) * uVar77;
                    uVar74 = (uint)(iVar27 < iVar97) * iVar97 | (uint)(iVar27 >= iVar97) * iVar27;
                    iVar27 = auVar82._4_4_;
                    iVar36 = auVar91._4_4_;
                    uVar76 = (uint)(iVar36 < iVar27) * iVar27 | (uint)(iVar36 >= iVar27) * iVar36;
                    iVar36 = auVar82._8_4_;
                    iVar28 = auVar91._8_4_;
                    iVar48 = auVar91._12_4_;
                    uVar77 = (uint)(iVar28 < iVar36) * iVar36 | (uint)(iVar28 >= iVar36) * iVar28;
                    iVar28 = auVar82._12_4_;
                    uVar60 = (uint)(iVar48 < iVar28) * iVar28 | (uint)(iVar48 >= iVar28) * iVar48;
                    iVar48 = uVar47 - open;
                    iVar50 = uVar49 - open;
                    iVar52 = uVar51 - open;
                    iVar55 = uVar54 - open;
                    iVar62 = iVar62 - gap;
                    iVar68 = iVar68 - gap;
                    iVar70 = iVar70 - gap;
                    iVar72 = iVar72 - gap;
                    auVar82._0_4_ = -(uint)(iVar62 < iVar48);
                    auVar82._4_4_ = -(uint)(iVar68 < iVar50);
                    auVar82._8_4_ = -(uint)(iVar70 < iVar52);
                    auVar82._12_4_ = -(uint)(iVar72 < iVar55);
                    auVar103 = blendvps(auVar66,auVar106,auVar82);
                    auVar64 = blendvps(auVar64,auVar91,auVar82);
                    local_1a8._0_4_ = (int)uVar10;
                    local_1a8._4_4_ = (int)((ulong)uVar10 >> 0x20);
                    uStack_1a0._0_4_ = (int)uVar11;
                    uStack_1a0._4_4_ = (int)((ulong)uVar11 >> 0x20);
                    auVar105._0_4_ = (int)local_1a8 + 1;
                    auVar105._4_4_ = local_1a8._4_4_ + 1;
                    auVar105._8_4_ = (int)uStack_1a0 + 1;
                    auVar105._12_4_ = uStack_1a0._4_4_ + 1;
                    auVar83._0_4_ = iVar97 + 1;
                    auVar83._4_4_ = iVar27 + 1;
                    auVar83._8_4_ = iVar36 + 1;
                    auVar83._12_4_ = iVar28 + 1;
                    auVar82 = blendvps(auVar105,auVar83,auVar82);
                    iVar36 = uVar100 - gap;
                    iVar28 = uVar101 - gap;
                    iVar97 = uVar102 - gap;
                    iVar99 = uVar90 - gap;
                    auVar66._0_4_ = -(uint)(iVar36 < iVar48);
                    auVar66._4_4_ = -(uint)(iVar28 < iVar50);
                    auVar66._8_4_ = -(uint)(iVar97 < iVar52);
                    auVar66._12_4_ = -(uint)(iVar99 < iVar55);
                    auVar89 = blendvps(auVar89,auVar106,auVar66);
                    auVar86 = blendvps(auVar86,auVar91,auVar66);
                    uVar73 = (uint)((int)uVar73 < iVar104) * iVar104 |
                             ((int)uVar73 >= iVar104) * uVar73;
                    iVar27 = auVar106._4_4_;
                    uVar100 = (uint)((int)uVar56 < iVar27) * iVar27 |
                              ((int)uVar56 >= iVar27) * uVar56;
                    iVar27 = auVar106._8_4_;
                    uVar101 = (uint)((int)uVar58 < iVar27) * iVar27 |
                              ((int)uVar58 >= iVar27) * uVar58;
                    iVar27 = auVar106._12_4_;
                    uVar102 = (uint)((int)uVar59 < iVar27) * iVar27 |
                              ((int)uVar59 >= iVar27) * uVar59;
                    uVar73 = ((int)uVar74 < (int)uVar73) * uVar73 |
                             ((int)uVar74 >= (int)uVar73) * uVar74;
                    uVar74 = ((int)uVar76 < (int)uVar100) * uVar100 |
                             ((int)uVar76 >= (int)uVar100) * uVar76;
                    uVar76 = ((int)uVar77 < (int)uVar101) * uVar101 |
                             ((int)uVar77 >= (int)uVar101) * uVar77;
                    uVar77 = ((int)uVar60 < (int)uVar102) * uVar102 |
                             ((int)uVar60 >= (int)uVar102) * uVar60;
                    puVar3 = (uint *)((long)*ptr_02 + lVar35);
                    *puVar3 = (uint)(iVar48 < iVar62) * iVar62 | (uint)(iVar48 >= iVar62) * iVar48;
                    puVar3[1] = (uint)(iVar50 < iVar68) * iVar68 | (uint)(iVar50 >= iVar68) * iVar50
                    ;
                    puVar3[2] = (uint)(iVar52 < iVar70) * iVar70 | (uint)(iVar52 >= iVar70) * iVar52
                    ;
                    puVar3[3] = (uint)(iVar55 < iVar72) * iVar72 | (uint)(iVar55 >= iVar72) * iVar55
                    ;
                    *(undefined1 (*) [16])((long)*b_00 + lVar35) = auVar103;
                    local_128 = auVar64._0_8_;
                    uStack_120 = auVar64._8_8_;
                    puVar4 = (undefined8 *)((long)*b_01 + lVar35);
                    *puVar4 = local_128;
                    puVar4[1] = uStack_120;
                    local_1a8 = auVar82._0_8_;
                    uStack_1a0 = auVar82._8_8_;
                    puVar4 = (undefined8 *)((long)*b_02 + lVar35);
                    *puVar4 = local_1a8;
                    puVar4[1] = uStack_1a0;
                    auVar64._0_4_ = auVar87._0_4_ + 1;
                    auVar64._4_4_ = auVar87._4_4_ + 1;
                    auVar64._8_4_ = auVar87._8_4_ + 1;
                    auVar64._12_4_ = auVar87._12_4_ + 1;
                    auVar87 = blendvps(auVar64,auVar83,auVar66);
                    uVar100 = (uint)(iVar48 < iVar36) * iVar36 | (uint)(iVar48 >= iVar36) * iVar48;
                    uVar101 = (uint)(iVar50 < iVar28) * iVar28 | (uint)(iVar50 >= iVar28) * iVar50;
                    uVar102 = (uint)(iVar52 < iVar97) * iVar97 | (uint)(iVar52 >= iVar97) * iVar52;
                    uVar90 = (uint)(iVar55 < iVar99) * iVar99 | (uint)(iVar55 >= iVar99) * iVar55;
                    piVar1 = (int *)((long)*palVar18 + lVar35);
                    iVar57 = *piVar1;
                    iVar27 = piVar1[1];
                    iVar36 = piVar1[2];
                    iVar28 = piVar1[3];
                    piVar1 = (int *)((long)*ptr + lVar35);
                    iVar97 = *piVar1;
                    iVar99 = piVar1[1];
                    iVar104 = piVar1[2];
                    iVar92 = piVar1[3];
                    piVar1 = (int *)((long)*ptr_00 + lVar35);
                    iVar48 = *piVar1;
                    iVar50 = piVar1[1];
                    iVar52 = piVar1[2];
                    iVar55 = piVar1[3];
                    piVar1 = (int *)((long)*ptr_01 + lVar35);
                    iVar93 = *piVar1;
                    iVar95 = piVar1[1];
                    iVar96 = piVar1[2];
                    iVar98 = piVar1[3];
                    lVar35 = lVar35 + 0x10;
                    lVar31 = lVar31 + uVar40 * 4;
                  } while (lVar34 != lVar35);
                  uVar90 = 0;
                  do {
                    lVar31 = auVar89._8_8_;
                    uVar85 = auVar89._0_8_;
                    auVar89._0_8_ = uVar85 << 0x20;
                    auVar89._8_8_ = lVar31 << 0x20 | uVar85 >> 0x20;
                    lVar31 = auVar86._8_8_;
                    uVar85 = auVar86._0_8_;
                    auVar86._0_8_ = uVar85 << 0x20;
                    auVar86._8_8_ = lVar31 << 0x20 | uVar85 >> 0x20;
                    uVar47 = (uint)(*palVar20)[0];
                    uVar49 = *(uint *)((long)*palVar20 + 4);
                    uVar51 = (uint)(*palVar20)[1];
                    uVar54 = ptr_03[uVar22];
                    auVar88._0_4_ = auVar87._0_4_;
                    auVar88._4_4_ = auVar88._0_4_;
                    auVar88._8_4_ = auVar87._4_4_;
                    auVar88._12_4_ = auVar87._8_4_;
                    auVar87._8_8_ = auVar88._8_8_;
                    auVar87._0_8_ = (ulong)auVar88._0_4_ << 0x20 | 1;
                    lVar35 = 0;
                    lVar31 = lVar32;
                    uVar58 = ptr_03[uVar22 + 1] - open;
                    uVar59 = uVar100;
                    uVar60 = uVar101;
                    uVar56 = uVar102;
                    do {
                      uVar102 = uVar60;
                      uVar101 = uVar59;
                      uVar100 = uVar58;
                      piVar1 = (int *)((long)pvVar5 + lVar35 + lVar26);
                      uVar54 = uVar54 + *piVar1;
                      uVar47 = uVar47 + piVar1[1];
                      uVar49 = uVar49 + piVar1[2];
                      uVar51 = uVar51 + piVar1[3];
                      piVar1 = (int *)((long)*local_1b0 + lVar35);
                      iVar27 = *piVar1;
                      iVar36 = piVar1[1];
                      iVar28 = piVar1[2];
                      iVar48 = piVar1[3];
                      uVar58 = (iVar27 < (int)uVar100) * uVar100 |
                               (uint)(iVar27 >= (int)uVar100) * iVar27;
                      uVar59 = (iVar36 < (int)uVar101) * uVar101 |
                               (uint)(iVar36 >= (int)uVar101) * iVar36;
                      uVar60 = (iVar28 < (int)uVar102) * uVar102 |
                               (uint)(iVar28 >= (int)uVar102) * iVar28;
                      uVar61 = (iVar48 < (int)uVar56) * uVar56 |
                               (uint)(iVar48 >= (int)uVar56) * iVar48;
                      puVar3 = (uint *)((long)*local_1b0 + lVar35);
                      *puVar3 = uVar58;
                      puVar3[1] = uVar59;
                      puVar3[2] = uVar60;
                      puVar3[3] = uVar61;
                      auVar65._0_4_ = -(uint)(uVar58 == uVar54);
                      auVar65._4_4_ = -(uint)(uVar59 == uVar47);
                      auVar65._8_4_ = -(uint)(uVar60 == uVar49);
                      auVar65._12_4_ = -(uint)(uVar61 == uVar51);
                      auVar44._0_4_ = -(uint)((int)uVar100 < iVar27);
                      auVar44._4_4_ = -(uint)((int)uVar101 < iVar36);
                      auVar44._8_4_ = -(uint)((int)uVar102 < iVar28);
                      auVar44._12_4_ = -(uint)((int)uVar56 < iVar48);
                      auVar44 = auVar44 | auVar65;
                      auVar66 = blendvps(auVar89,*(undefined1 (*) [16])((long)*palVar17 + lVar35),
                                         auVar44);
                      *(undefined1 (*) [16])((long)*palVar17 + lVar35) = auVar66;
                      auVar64 = blendvps(auVar86,*(undefined1 (*) [16])((long)*local_1c0 + lVar35),
                                         auVar44);
                      *(undefined1 (*) [16])((long)*local_1c0 + lVar35) = auVar64;
                      auVar82 = blendvps(auVar87,*(undefined1 (*) [16])((long)*local_188 + lVar35),
                                         auVar44);
                      *(undefined1 (*) [16])((long)*local_188 + lVar35) = auVar82;
                      lVar41 = *(long *)((long)((ppVar16->field_4).trace)->trace_del_table + 8);
                      iVar27 = auVar66._0_4_;
                      *(int *)(lVar41 + lVar31) = iVar27;
                      lVar41 = lVar41 + lVar31;
                      uVar9 = extractps(auVar66,1);
                      *(undefined8 *)(lVar29 + lVar41) = uVar9;
                      uVar9 = extractps(auVar66,2);
                      *(undefined8 *)(lVar25 + lVar41) = uVar9;
                      uVar9 = extractps(auVar66,3);
                      *(undefined8 *)(lVar30 + lVar41) = uVar9;
                      lVar41 = *(long *)((long)((ppVar16->field_4).trace)->trace_del_table + 0x10);
                      iVar36 = auVar64._0_4_;
                      *(int *)(lVar41 + lVar31) = iVar36;
                      lVar41 = lVar41 + lVar31;
                      uVar9 = extractps(auVar64,1);
                      *(undefined8 *)(lVar29 + lVar41) = uVar9;
                      uVar9 = extractps(auVar64,2);
                      *(undefined8 *)(lVar25 + lVar41) = uVar9;
                      uVar9 = extractps(auVar64,3);
                      *(undefined8 *)(lVar30 + lVar41) = uVar9;
                      lVar41 = *(long *)((long)((ppVar16->field_4).trace)->trace_del_table + 0x18);
                      iVar28 = auVar82._0_4_;
                      *(int *)(lVar41 + lVar31) = iVar28;
                      lVar41 = lVar41 + lVar31;
                      uVar9 = extractps(auVar82,1);
                      *(undefined8 *)(lVar29 + lVar41) = uVar9;
                      uVar9 = extractps(auVar82,2);
                      *(undefined8 *)(lVar25 + lVar41) = uVar9;
                      uVar9 = extractps(auVar82,3);
                      *(undefined8 *)(lVar30 + lVar41) = uVar9;
                      lVar41 = *((ppVar16->field_4).trace)->trace_del_table;
                      *(uint *)(lVar41 + lVar31) = uVar58;
                      lVar41 = lVar41 + lVar31;
                      *(uint *)(lVar29 + lVar41) = uVar59;
                      *(uint *)(lVar25 + lVar41) = uVar60;
                      *(uint *)(lVar30 + lVar41) = uVar61;
                      auVar45._0_4_ = -(uint)((int)(uVar100 - gap) < (int)(uVar58 - open));
                      auVar45._4_4_ = -(uint)((int)(uVar101 - gap) < (int)(uVar59 - open));
                      auVar45._8_4_ = -(uint)((int)(uVar102 - gap) < (int)(uVar60 - open));
                      auVar45._12_4_ = -(uint)((int)(uVar56 - gap) < (int)(uVar61 - open));
                      uVar33 = ((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                                (ushort)((byte)(auVar45._12_4_ >> 7) & 1) << 0xc |
                                (ushort)((byte)(auVar45._12_4_ >> 0xf) & 1) << 0xd |
                                (ushort)((byte)(auVar45._12_4_ >> 0x17) & 1) << 0xe |
                               (ushort)(byte)(auVar45._12_4_ >> 0x1f) << 0xf) ^ 0xffff;
                      if (uVar33 == 0) {
                        iVar48 = 0x27;
                      }
                      else {
                        auVar89 = blendvps(auVar89,auVar66,auVar45);
                        auVar86 = blendvps(auVar86,auVar64,auVar45);
                        auVar103 = blendvps(auVar87,auVar82,auVar45);
                        auVar87._0_4_ = auVar103._0_4_ + 1;
                        auVar87._4_4_ = auVar103._4_4_ + 1;
                        auVar87._8_4_ = auVar103._8_4_ + 1;
                        auVar87._12_4_ = auVar103._12_4_ + 1;
                        puVar3 = (uint *)((long)*palVar18 + lVar35);
                        uVar54 = *puVar3;
                        uVar47 = puVar3[1];
                        uVar49 = puVar3[2];
                        uVar51 = puVar3[3];
                        iVar48 = 0;
                        uVar100 = uVar100 - gap;
                        uVar101 = uVar101 - gap;
                        uVar102 = uVar102 - gap;
                        uVar56 = uVar56 - gap;
                      }
                      uVar78 = ((int)uVar58 < (int)uVar78) * uVar58 |
                               ((int)uVar58 >= (int)uVar78) * uVar78;
                      uVar79 = ((int)uVar59 < (int)uVar79) * uVar59 |
                               ((int)uVar59 >= (int)uVar79) * uVar79;
                      uVar80 = ((int)uVar60 < (int)uVar80) * uVar60 |
                               ((int)uVar60 >= (int)uVar80) * uVar80;
                      uVar81 = ((int)uVar61 < (int)uVar81) * uVar61 |
                               ((int)uVar61 >= (int)uVar81) * uVar81;
                      uVar73 = ((int)uVar73 < (int)uVar58) * uVar58 |
                               ((int)uVar73 >= (int)uVar58) * uVar73;
                      uVar74 = ((int)uVar74 < (int)uVar59) * uVar59 |
                               ((int)uVar74 >= (int)uVar59) * uVar74;
                      uVar76 = ((int)uVar76 < (int)uVar60) * uVar60 |
                               ((int)uVar76 >= (int)uVar60) * uVar76;
                      uVar77 = ((int)uVar77 < (int)uVar61) * uVar61 |
                               ((int)uVar77 >= (int)uVar61) * uVar77;
                      uVar73 = (uint)((int)uVar73 < iVar27) * iVar27 |
                               ((int)uVar73 >= iVar27) * uVar73;
                      iVar27 = auVar66._4_4_;
                      uVar74 = (uint)((int)uVar74 < iVar27) * iVar27 |
                               ((int)uVar74 >= iVar27) * uVar74;
                      iVar27 = auVar66._8_4_;
                      uVar76 = (uint)((int)uVar76 < iVar27) * iVar27 |
                               ((int)uVar76 >= iVar27) * uVar76;
                      iVar27 = auVar66._12_4_;
                      uVar77 = (uint)((int)uVar77 < iVar27) * iVar27 |
                               ((int)uVar77 >= iVar27) * uVar77;
                      uVar58 = (uint)(iVar36 < iVar28) * iVar28 | (uint)(iVar36 >= iVar28) * iVar36;
                      iVar27 = auVar82._4_4_;
                      iVar36 = auVar64._4_4_;
                      uVar59 = (uint)(iVar36 < iVar27) * iVar27 | (uint)(iVar36 >= iVar27) * iVar36;
                      iVar27 = auVar82._8_4_;
                      iVar36 = auVar64._8_4_;
                      iVar28 = auVar64._12_4_;
                      uVar60 = (uint)(iVar36 < iVar27) * iVar27 | (uint)(iVar36 >= iVar27) * iVar36;
                      iVar27 = auVar82._12_4_;
                      uVar61 = (uint)(iVar28 < iVar27) * iVar27 | (uint)(iVar28 >= iVar27) * iVar28;
                      uVar73 = ((int)uVar58 < (int)uVar73) * uVar73 |
                               ((int)uVar58 >= (int)uVar73) * uVar58;
                      uVar74 = ((int)uVar59 < (int)uVar74) * uVar74 |
                               ((int)uVar59 >= (int)uVar74) * uVar59;
                      uVar76 = ((int)uVar60 < (int)uVar76) * uVar76 |
                               ((int)uVar60 >= (int)uVar76) * uVar60;
                      uVar77 = ((int)uVar61 < (int)uVar77) * uVar77 |
                               ((int)uVar61 >= (int)uVar77) * uVar61;
                      if (uVar33 == 0) goto LAB_006cd10e;
                      lVar35 = lVar35 + 0x10;
                      lVar31 = lVar31 + uVar40 * 4;
                      uVar58 = uVar100;
                      uVar59 = uVar101;
                      uVar60 = uVar102;
                    } while (lVar34 != lVar35);
                    iVar48 = 0;
LAB_006cd10e:
                  } while ((iVar48 == 0) && (bVar42 = uVar90 < 3, uVar90 = uVar90 + 1, bVar42));
                  uVar22 = uVar22 + 1;
                  lVar32 = lVar32 + 4;
                  local_1a8 = local_1b0;
                  palVar20 = local_188;
                  palVar19 = palVar17;
                  b = local_1c0;
                  if (uVar22 == uVar24) {
                    iVar27 = uVar23 * 0x10;
                    uVar40 = local_1b0[uVar23][0];
                    uVar38 = local_1b0[uVar23][1];
                    uVar24 = palVar17[uVar23][0];
                    uVar22 = palVar17[uVar23][1];
                    uVar85 = local_1c0[uVar23][0];
                    uVar53 = local_1c0[uVar23][1];
                    uVar43 = local_188[uVar23][0];
                    uVar46 = local_188[uVar23][1];
                    if (iVar39 / iVar37 < 3) {
                      iVar27 = 1;
                      if (1 < iVar14) {
                        iVar27 = iVar14;
                      }
                      do {
                        uVar38 = uVar38 << 0x20 | uVar40 >> 0x20;
                        uVar22 = uVar22 << 0x20 | uVar24 >> 0x20;
                        uVar53 = uVar53 << 0x20 | uVar85 >> 0x20;
                        uVar46 = uVar46 << 0x20 | uVar43 >> 0x20;
                        iVar27 = iVar27 + -1;
                        uVar40 = uVar40 << 0x20;
                        uVar24 = uVar24 << 0x20;
                        uVar85 = uVar85 << 0x20;
                        uVar43 = uVar43 << 0x20;
                      } while (iVar27 != 0);
                    }
                    auVar84._0_4_ = -(uint)((int)uVar78 < (int)uVar15);
                    auVar84._4_4_ = -(uint)((int)uVar79 < (int)uVar15);
                    auVar84._8_4_ = -(uint)((int)uVar80 < (int)uVar15);
                    auVar84._12_4_ = -(uint)((int)uVar81 < (int)uVar15);
                    auVar75._0_4_ = -(uint)((int)uVar12 < (int)uVar73);
                    auVar75._4_4_ = -(uint)((int)uVar12 < (int)uVar74);
                    auVar75._8_4_ = -(uint)((int)uVar12 < (int)uVar76);
                    auVar75._12_4_ = -(uint)((int)uVar12 < (int)uVar77);
                    iVar27 = movmskps(iVar27,auVar75 | auVar84);
                    if (iVar27 == 0) {
                      iVar27 = (int)(uVar38 >> 0x20);
                      iVar36 = (int)(uVar22 >> 0x20);
                      iVar37 = (int)(uVar53 >> 0x20);
                      iVar14 = (int)(uVar46 >> 0x20);
                    }
                    else {
                      *(byte *)&ppVar16->flag = (byte)ppVar16->flag | 0x40;
                      iVar27 = 0;
                      iVar36 = 0;
                      iVar37 = 0;
                      iVar14 = 0;
                      iVar13 = 0;
                      iVar39 = 0;
                    }
                    ppVar16->score = iVar27;
                    ppVar16->end_query = iVar39;
                    ppVar16->end_ref = iVar13;
                    ((ppVar16->field_4).stats)->matches = iVar36;
                    ((ppVar16->field_4).stats)->similar = iVar37;
                    ((ppVar16->field_4).stats)->length = iVar14;
                    parasail_free(ptr_03);
                    parasail_free(b_02);
                    parasail_free(b_01);
                    parasail_free(b_00);
                    parasail_free(ptr_02);
                    parasail_free(ptr_01);
                    parasail_free(local_188);
                    parasail_free(ptr_00);
                    parasail_free(local_1c0);
                    parasail_free(ptr);
                    parasail_free(palVar17);
                    parasail_free(palVar18);
                    parasail_free(local_1b0);
                    return ppVar16;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile32.score;
    vProfileM = (__m128i*)profile->profile32.matches;
    vProfileS = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);
        vHM = _mm_slli_si128(vHM, 4);
        vHS = _mm_slli_si128(vHS, 4);
        vHL = _mm_slli_si128(vHL, 4);

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi32(vH_dag, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi32(vH, vH_dag);
            case2 = _mm_cmpeq_epi32(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi32(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi32(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi32(vEL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi32(vFL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 4);
            vF = _mm_slli_si128(vF, 4);
            vFM = _mm_slli_si128(vFM, 4);
            vFS = _mm_slli_si128(vFS, 4);
            vFL = _mm_slli_si128(vFL, 4);
            vHp = _mm_insert_epi32(vHp, boundary[j], 0);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            vFL = _mm_insert_epi32(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi32(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi32(vH, vHp);
                case2 = _mm_cmpeq_epi32(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_sub_epi32(vH, vGapO);
                vF_ext = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm_cmpeq_epi32(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi32(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi32(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi32(vFL, vOne),
                        _mm_add_epi32(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128 (vH, 4);
                vHM = _mm_slli_si128 (vHM, 4);
                vHS = _mm_slli_si128 (vHS, 4);
                vHL = _mm_slli_si128 (vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32 (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32 (vHS, 3);
            result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32 (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 4);
            vHM = _mm_slli_si128 (vHM, 4);
            vHS = _mm_slli_si128 (vHS, 4);
            vHL = _mm_slli_si128 (vHL, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
        matches = (int32_t) _mm_extract_epi32 (vHM, 3);
        similar = (int32_t) _mm_extract_epi32 (vHS, 3);
        length = (int32_t) _mm_extract_epi32 (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}